

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

bool __thiscall duckdb_re2::DFA::PossibleMatchRange(DFA *this,string *min,string *max,int maxlen)

{
  bool bVar1;
  mapped_type *pmVar2;
  State *pSVar3;
  ulong uVar4;
  int in_ECX;
  string *in_RDX;
  string *in_RSI;
  DFA *in_RDI;
  State *ns_1;
  int j_1;
  bool extended_1;
  int i_1;
  int j;
  bool extended;
  State *ns;
  int i;
  MutexLock lock;
  State *s;
  SearchParams params;
  RWLocker l;
  unordered_map<duckdb_re2::DFA::State_*,_int,_std::hash<duckdb_re2::DFA::State_*>,_std::equal_to<duckdb_re2::DFA::State_*>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>_>
  previously_visited_states;
  SearchParams *in_stack_000001f0;
  DFA *in_stack_000001f8;
  int in_stack_0000037c;
  State *in_stack_00000380;
  DFA *in_stack_00000388;
  State *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  int local_12c;
  int local_124;
  int local_120;
  int local_10c;
  StringPiece local_f0;
  StringPiece local_e0;
  SearchParams local_d0;
  RWLocker local_70 [4];
  int local_24;
  string *local_20;
  string *local_18;
  byte local_1;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = ok(in_RDI);
  if (bVar1) {
    std::
    unordered_map<duckdb_re2::DFA::State_*,_int,_std::hash<duckdb_re2::DFA::State_*>,_std::equal_to<duckdb_re2::DFA::State_*>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>_>
    ::unordered_map((unordered_map<duckdb_re2::DFA::State_*,_int,_std::hash<duckdb_re2::DFA::State_*>,_std::equal_to<duckdb_re2::DFA::State_*>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>_>
                     *)0x824986);
    RWLocker::RWLocker((RWLocker *)in_stack_fffffffffffffe80,(CacheMutex *)in_stack_fffffffffffffe78
                      );
    StringPiece::StringPiece(&local_e0);
    StringPiece::StringPiece(&local_f0);
    SearchParams::SearchParams(&local_d0,&local_e0,&local_f0,local_70);
    local_d0.anchored = true;
    bVar1 = AnalyzeSearch(in_stack_000001f8,in_stack_000001f0);
    if (bVar1) {
      if (local_d0.start == (State *)0x1) {
        std::__cxx11::string::operator=(local_18,anon_var_dwarf_65e8f3 + 9);
        std::__cxx11::string::operator=(local_20,anon_var_dwarf_65e8f3 + 9);
        local_1 = 1;
      }
      else if (local_d0.start == (State *)0x2) {
        local_1 = 0;
      }
      else {
        std::__cxx11::string::clear();
        MutexLock::MutexLock
                  ((MutexLock *)in_stack_fffffffffffffe80,(Mutex *)in_stack_fffffffffffffe78);
        local_10c = 0;
        while ((local_10c < local_24 &&
               (pmVar2 = std::
                         unordered_map<duckdb_re2::DFA::State_*,_int,_std::hash<duckdb_re2::DFA::State_*>,_std::equal_to<duckdb_re2::DFA::State_*>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>_>
                         ::operator[]((unordered_map<duckdb_re2::DFA::State_*,_int,_std::hash<duckdb_re2::DFA::State_*>,_std::equal_to<duckdb_re2::DFA::State_*>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>_>
                                       *)in_stack_fffffffffffffe80,
                                      (key_type *)in_stack_fffffffffffffe78),
               *pmVar2 <= PossibleMatchRange::kMaxEltRepetitions))) {
          pmVar2 = std::
                   unordered_map<duckdb_re2::DFA::State_*,_int,_std::hash<duckdb_re2::DFA::State_*>,_std::equal_to<duckdb_re2::DFA::State_*>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>_>
                   ::operator[]((unordered_map<duckdb_re2::DFA::State_*,_int,_std::hash<duckdb_re2::DFA::State_*>,_std::equal_to<duckdb_re2::DFA::State_*>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>_>
                                 *)in_stack_fffffffffffffe80,(key_type *)in_stack_fffffffffffffe78);
          *pmVar2 = *pmVar2 + 1;
          pSVar3 = RunStateOnByte(in_stack_00000388,in_stack_00000380,in_stack_0000037c);
          if (pSVar3 == (State *)0x0) {
            local_1 = 0;
            goto LAB_00824ecc;
          }
          if ((pSVar3 != (State *)0x1) &&
             ((pSVar3 == (State *)0x2 || (bVar1 = State::IsMatch(pSVar3), bVar1)))) break;
          bVar1 = false;
          for (local_120 = 0; local_120 < 0x100; local_120 = local_120 + 1) {
            pSVar3 = RunStateOnByte(in_stack_00000388,in_stack_00000380,in_stack_0000037c);
            if (pSVar3 == (State *)0x0) {
              local_1 = 0;
              goto LAB_00824ecc;
            }
            if ((pSVar3 == (State *)0x2) || (((State *)0x2 < pSVar3 && (0 < pSVar3->ninst_)))) {
              bVar1 = true;
              std::__cxx11::string::append((ulong)local_18,'\x01');
              break;
            }
          }
          if (!bVar1) break;
          local_10c = local_10c + 1;
        }
        std::
        unordered_map<duckdb_re2::DFA::State_*,_int,_std::hash<duckdb_re2::DFA::State_*>,_std::equal_to<duckdb_re2::DFA::State_*>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>_>
        ::clear((unordered_map<duckdb_re2::DFA::State_*,_int,_std::hash<duckdb_re2::DFA::State_*>,_std::equal_to<duckdb_re2::DFA::State_*>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>_>
                 *)0x824d07);
        std::__cxx11::string::clear();
        local_124 = 0;
        while ((local_124 < local_24 &&
               (pmVar2 = std::
                         unordered_map<duckdb_re2::DFA::State_*,_int,_std::hash<duckdb_re2::DFA::State_*>,_std::equal_to<duckdb_re2::DFA::State_*>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>_>
                         ::operator[]((unordered_map<duckdb_re2::DFA::State_*,_int,_std::hash<duckdb_re2::DFA::State_*>,_std::equal_to<duckdb_re2::DFA::State_*>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>_>
                                       *)in_stack_fffffffffffffe80,
                                      (key_type *)in_stack_fffffffffffffe78),
               *pmVar2 <= PossibleMatchRange::kMaxEltRepetitions))) {
          in_stack_fffffffffffffe80 =
               (string *)
               std::
               unordered_map<duckdb_re2::DFA::State_*,_int,_std::hash<duckdb_re2::DFA::State_*>,_std::equal_to<duckdb_re2::DFA::State_*>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>_>
               ::operator[]((unordered_map<duckdb_re2::DFA::State_*,_int,_std::hash<duckdb_re2::DFA::State_*>,_std::equal_to<duckdb_re2::DFA::State_*>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>_>
                             *)in_stack_fffffffffffffe80,(key_type *)in_stack_fffffffffffffe78);
          *(int *)in_stack_fffffffffffffe80 = *(int *)in_stack_fffffffffffffe80 + 1;
          bVar1 = false;
          for (local_12c = 0xff; -1 < local_12c; local_12c = local_12c + -1) {
            in_stack_fffffffffffffe78 =
                 RunStateOnByte(in_stack_00000388,in_stack_00000380,in_stack_0000037c);
            if (in_stack_fffffffffffffe78 == (State *)0x0) {
              local_1 = 0;
              goto LAB_00824ecc;
            }
            if ((in_stack_fffffffffffffe78 == (State *)0x2) ||
               (((State *)0x2 < in_stack_fffffffffffffe78 && (0 < in_stack_fffffffffffffe78->ninst_)
                ))) {
              bVar1 = true;
              std::__cxx11::string::append((ulong)local_20,'\x01');
              break;
            }
          }
          if (!bVar1) {
            local_1 = 1;
            goto LAB_00824ecc;
          }
          local_124 = local_124 + 1;
        }
        PrefixSuccessor(in_stack_fffffffffffffe80);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          local_1 = 1;
        }
        else {
          local_1 = 0;
        }
LAB_00824ecc:
        MutexLock::~MutexLock((MutexLock *)0x824ed9);
      }
    }
    else {
      local_1 = 0;
    }
    RWLocker::~RWLocker((RWLocker *)in_stack_fffffffffffffe80);
    std::
    unordered_map<duckdb_re2::DFA::State_*,_int,_std::hash<duckdb_re2::DFA::State_*>,_std::equal_to<duckdb_re2::DFA::State_*>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>_>
    ::~unordered_map((unordered_map<duckdb_re2::DFA::State_*,_int,_std::hash<duckdb_re2::DFA::State_*>,_std::equal_to<duckdb_re2::DFA::State_*>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>_>
                      *)0x824ef3);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool DFA::PossibleMatchRange(std::string* min, std::string* max, int maxlen) {
  if (!ok())
    return false;

  // NOTE: if future users of PossibleMatchRange want more precision when
  // presented with infinitely repeated elements, consider making this a
  // parameter to PossibleMatchRange.
  static int kMaxEltRepetitions = 0;

  // Keep track of the number of times we've visited states previously. We only
  // revisit a given state if it's part of a repeated group, so if the value
  // portion of the map tuple exceeds kMaxEltRepetitions we bail out and set
  // |*max| to |PrefixSuccessor(*max)|.
  //
  // Also note that previously_visited_states[UnseenStatePtr] will, in the STL
  // tradition, implicitly insert a '0' value at first use. We take advantage
  // of that property below.
  std::unordered_map<State*, int> previously_visited_states;

  // Pick out start state for anchored search at beginning of text.
  RWLocker l(&cache_mutex_);
  SearchParams params(StringPiece(), StringPiece(), &l);
  params.anchored = true;
  if (!AnalyzeSearch(&params))
    return false;
  if (params.start == DeadState) {  // No matching strings
    *min = "";
    *max = "";
    return true;
  }
  if (params.start == FullMatchState)  // Every string matches: no max
    return false;

  // The DFA is essentially a big graph rooted at params.start,
  // and paths in the graph correspond to accepted strings.
  // Each node in the graph has potentially 256+1 arrows
  // coming out, one for each byte plus the magic end of
  // text character kByteEndText.

  // To find the smallest possible prefix of an accepted
  // string, we just walk the graph preferring to follow
  // arrows with the lowest bytes possible.  To find the
  // largest possible prefix, we follow the largest bytes
  // possible.

  // The test for whether there is an arrow from s on byte j is
  //    ns = RunStateOnByteUnlocked(s, j);
  //    if (ns == NULL)
  //      return false;
  //    if (ns != DeadState && ns->ninst > 0)
  // The RunStateOnByteUnlocked call asks the DFA to build out the graph.
  // It returns NULL only if the DFA has run out of memory,
  // in which case we can't be sure of anything.
  // The second check sees whether there was graph built
  // and whether it is interesting graph.  Nodes might have
  // ns->ninst == 0 if they exist only to represent the fact
  // that a match was found on the previous byte.

  // Build minimum prefix.
  State* s = params.start;
  min->clear();
  MutexLock lock(&mutex_);
  for (int i = 0; i < maxlen; i++) {
    if (previously_visited_states[s] > kMaxEltRepetitions)
      break;
    previously_visited_states[s]++;

    // Stop if min is a match.
    State* ns = RunStateOnByte(s, kByteEndText);
    if (ns == NULL)  // DFA out of memory
      return false;
    if (ns != DeadState && (ns == FullMatchState || ns->IsMatch()))
      break;

    // Try to extend the string with low bytes.
    bool extended = false;
    for (int j = 0; j < 256; j++) {
      ns = RunStateOnByte(s, j);
      if (ns == NULL)  // DFA out of memory
        return false;
      if (ns == FullMatchState ||
          (ns > SpecialStateMax && ns->ninst_ > 0)) {
        extended = true;
        min->append(1, static_cast<char>(j));
        s = ns;
        break;
      }
    }
    if (!extended)
      break;
  }

  // Build maximum prefix.
  previously_visited_states.clear();
  s = params.start;
  max->clear();
  for (int i = 0; i < maxlen; i++) {
    if (previously_visited_states[s] > kMaxEltRepetitions)
      break;
    previously_visited_states[s] += 1;

    // Try to extend the string with high bytes.
    bool extended = false;
    for (int j = 255; j >= 0; j--) {
      State* ns = RunStateOnByte(s, j);
      if (ns == NULL)
        return false;
      if (ns == FullMatchState ||
          (ns > SpecialStateMax && ns->ninst_ > 0)) {
        extended = true;
        max->append(1, static_cast<char>(j));
        s = ns;
        break;
      }
    }
    if (!extended) {
      // Done, no need for PrefixSuccessor.
      return true;
    }
  }

  // Stopped while still adding to *max - round aaaaaaaaaa... to aaaa...b
  PrefixSuccessor(max);

  // If there are no bytes left, we have no way to say "there is no maximum
  // string".  We could make the interface more complicated and be able to
  // return "there is no maximum but here is a minimum", but that seems like
  // overkill -- the most common no-max case is all possible strings, so not
  // telling the caller that the empty string is the minimum match isn't a
  // great loss.
  if (max->empty())
    return false;

  return true;
}